

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.cpp
# Opt level: O0

string * YAML::Exp::Escape_abi_cxx11_(Stream *in)

{
  string *msg_;
  Stream *in_RSI;
  string *in_RDI;
  Mark MVar1;
  int in_stack_000000f4;
  Stream *in_stack_000000f8;
  stringstream msg;
  char ch;
  char escape;
  Stream *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  allocator local_221;
  string local_220 [64];
  Mark local_1e0;
  Mark local_1d0;
  stringstream local_1c0 [394];
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [18];
  allocator local_13;
  char local_12;
  char local_11;
  Stream *local_10;
  
  local_10 = in_RSI;
  local_11 = YAML::Stream::get(in_stack_fffffffffffffd10);
  local_12 = YAML::Stream::get(in_stack_fffffffffffffd10);
  if ((local_11 == '\'') && (local_12 == '\'')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"\'",&local_13);
    std::allocator<char>::~allocator((allocator<char> *)&local_13);
  }
  else {
    switch(local_12) {
    case '\t':
    case 't':
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"\t",&local_28);
      std::allocator<char>::~allocator((allocator<char> *)&local_28);
      break;
    default:
      std::__cxx11::stringstream::stringstream(local_1c0);
      msg_ = (string *)__cxa_allocate_exception(0x40);
      MVar1 = YAML::Stream::mark(local_10);
      local_1e0 = MVar1;
      local_1d0 = MVar1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_220,"unknown escape character: ",&local_221);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(MVar1.column,in_stack_fffffffffffffd18),(char)((ulong)msg_ >> 0x38));
      ParserException::ParserException
                (MVar1._0_8_,(Mark *)CONCAT44(MVar1.column,in_stack_fffffffffffffd18),msg_);
      __cxa_throw(msg_,&ParserException::typeinfo,ParserException::~ParserException);
    case ' ':
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI," ",&local_2e);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e);
      break;
    case '\"':
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"\"",&local_2f);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f);
      break;
    case '\'':
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"\'",&local_30);
      std::allocator<char>::~allocator((allocator<char> *)&local_30);
      break;
    case '/':
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"/",&local_32);
      std::allocator<char>::~allocator((allocator<char> *)&local_32);
      break;
    case '0':
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,1,'\0',local_25);
      std::allocator<char>::~allocator((allocator<char> *)local_25);
      break;
    case 'L':
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,anon_var_dwarf_d368ca,&local_35);
      std::allocator<char>::~allocator((allocator<char> *)&local_35);
      break;
    case 'N':
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,anon_var_dwarf_d368b6,&local_33);
      std::allocator<char>::~allocator((allocator<char> *)&local_33);
      break;
    case 'P':
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,anon_var_dwarf_d368e0,&local_36);
      std::allocator<char>::~allocator((allocator<char> *)&local_36);
      break;
    case 'U':
      Escape_abi_cxx11_(in_stack_000000f8,in_stack_000000f4);
      break;
    case '\\':
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"\\",&local_31);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
      break;
    case '_':
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,anon_var_dwarf_d368c0,&local_34);
      std::allocator<char>::~allocator((allocator<char> *)&local_34);
      break;
    case 'a':
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"\a",&local_26);
      std::allocator<char>::~allocator((allocator<char> *)&local_26);
      break;
    case 'b':
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"\b",&local_27);
      std::allocator<char>::~allocator((allocator<char> *)&local_27);
      break;
    case 'e':
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"\x1b",&local_2d);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d);
      break;
    case 'f':
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"\f",&local_2b);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b);
      break;
    case 'n':
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"\n",&local_29);
      std::allocator<char>::~allocator((allocator<char> *)&local_29);
      break;
    case 'r':
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"\r",&local_2c);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c);
      break;
    case 'u':
      Escape_abi_cxx11_(in_stack_000000f8,in_stack_000000f4);
      break;
    case 'v':
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"\v",&local_2a);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a);
      break;
    case 'x':
      Escape_abi_cxx11_(in_stack_000000f8,in_stack_000000f4);
    }
  }
  return in_RDI;
}

Assistant:

std::string Escape(Stream& in) {
  // eat slash
  char escape = in.get();

  // switch on escape character
  char ch = in.get();

  // first do single quote, since it's easier
  if (escape == '\'' && ch == '\'')
    return "\'";

  // now do the slash (we're not gonna check if it's a slash - you better pass
  // one!)
  switch (ch) {
    case '0':
      return std::string(1, '\x00');
    case 'a':
      return "\x07";
    case 'b':
      return "\x08";
    case 't':
    case '\t':
      return "\x09";
    case 'n':
      return "\x0A";
    case 'v':
      return "\x0B";
    case 'f':
      return "\x0C";
    case 'r':
      return "\x0D";
    case 'e':
      return "\x1B";
    case ' ':
      return R"( )";
    case '\"':
      return "\"";
    case '\'':
      return "\'";
    case '\\':
      return "\\";
    case '/':
      return "/";
    case 'N':
      return "\x85";
    case '_':
      return "\xA0";
    case 'L':
      return "\xE2\x80\xA8";  // LS (#x2028)
    case 'P':
      return "\xE2\x80\xA9";  // PS (#x2029)
    case 'x':
      return Escape(in, 2);
    case 'u':
      return Escape(in, 4);
    case 'U':
      return Escape(in, 8);
  }

  std::stringstream msg;
  throw ParserException(in.mark(), std::string(ErrorMsg::INVALID_ESCAPE) + ch);
}